

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O0

fid __thiscall ezexample::addf(ezexample *this,char to_ns,fid fint,float v)

{
  bool bVar1;
  fid in_EDX;
  char in_SIL;
  ezexample *in_RDI;
  float in_XMM0_Da;
  undefined4 in_stack_ffffffffffffffd4;
  fid fVar2;
  undefined4 in_stack_ffffffffffffffe0;
  float fVar3;
  fid local_4;
  
  if (in_SIL == '\0') {
    local_4 = 0;
  }
  else {
    bVar1 = ensure_ns_exists(in_RDI,(char)((uint)in_stack_ffffffffffffffd4 >> 0x18));
    if (bVar1) {
      local_4 = 0;
    }
    else {
      fVar2 = in_EDX;
      fVar3 = in_XMM0_Da;
      parameters::stride_shift
                ((parameters *)((in_RDI->ec->super_example_predict).feature_space + (int)in_SIL));
      features::push_back((features *)CONCAT44(fVar3,in_stack_ffffffffffffffe0),
                          (feature_value)((ulong)in_RDI >> 0x20),CONCAT44(fVar2,in_XMM0_Da));
      in_RDI->ec->total_sum_feat_sq = fVar3 * fVar3 + in_RDI->ec->total_sum_feat_sq;
      in_RDI->ec->num_features = in_RDI->ec->num_features + 1;
      in_RDI->example_changed_since_prediction = true;
      local_4 = in_EDX;
    }
  }
  return local_4;
}

Assistant:

inline fid addf(char to_ns, fid fint, float v)
  {
    if (to_ns == 0)
      return 0;
    if (ensure_ns_exists(to_ns))
      return 0;

    ec->feature_space[(int)to_ns].push_back(v, fint << vw_ref->weights.stride_shift());
    ec->total_sum_feat_sq += v * v;
    ec->num_features++;
    example_changed_since_prediction = true;
    return fint;
  }